

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O0

bool EndsWith(string *fullString,string *ending,bool caseInsensitive)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte in_DL;
  string *in_RSI;
  ulong in_RDI;
  string comparison;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  string *local_18;
  ulong local_10;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::length();
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::length();
  if (__rhs < pbVar1) {
    local_1 = 0;
  }
  else {
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_40,local_10);
    std::__cxx11::string::string(local_60,local_18);
    if ((local_19 & 1) != 0) {
      ToLowerInplace(in_stack_ffffffffffffff90);
      ToLowerInplace(in_stack_ffffffffffffff90);
    }
    local_1 = std::operator==(in_stack_ffffffffffffff90,__rhs);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool EndsWith(const std::string& fullString, const std::string& ending, bool caseInsensitive)
{
    if (fullString.length() >= ending.length())
    {
        auto substr = fullString.substr(fullString.length() - ending.length(), ending.length());
        auto comparison = ending;

        if (caseInsensitive)
        {
            ToLowerInplace(substr);
            ToLowerInplace(comparison);
        }

        return substr == comparison;
    } else {
        return false;
    }
}